

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_relative_pose.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  void *pvVar3;
  size_type sVar4;
  ostream *s;
  double dVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar6;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  timeval tVar23;
  timeval tVar24;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  transformation_t nonlinear_transformation_10;
  vector<int,_std::allocator<int>_> indices10;
  double nonlinear_time;
  size_t i_7;
  transformation_t nonlinear_transformation;
  double eigensolver_time;
  size_t i_6;
  rotation_t eigensolver_rotation;
  rotation_t R_perturbed;
  translation_t t_perturbed;
  double eightpt_time;
  size_t i_5;
  essential_t eightpt_essential;
  double sevenpt_time;
  size_t i_4;
  essentials_t sevenpt_essentials;
  double fivept_kneip_time;
  size_t i_3;
  vector<int,_std::allocator<int>_> indices5;
  rotations_t fivept_kneip_rotations;
  double fivept_nister_time;
  size_t i_2;
  essentials_t fivept_nister_essentials;
  double fivept_stewenius_time;
  size_t i_1;
  complexEssentials_t fivept_stewenius_essentials;
  double twopt_time;
  size_t i;
  translation_t twopt_translation;
  size_t iterations;
  timeval toc;
  timeval tic;
  CentralRelativeAdapter adapter;
  rotation_t rotation;
  translation_t position;
  MatrixXd gt;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  rotations_t camRotations;
  translations_t camOffsets;
  rotation_t rotation2;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  size_t numberPoints;
  double outlierFraction;
  double noise;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff420;
  undefined4 uVar25;
  Matrix<double,_3,_4,_0,_3,_4> *other;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffff428;
  RelativeAdapterBase *this;
  rotation_t *rotation_00;
  unsigned_long *in_stack_fffffffffffff438;
  CentralRelativeAdapter *this_00;
  int *in_stack_fffffffffffff440;
  RelativeAdapterBase *adapter_00;
  int n;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff448;
  vector<int,_std::allocator<int>_> *indices;
  RelativeAdapterBase *in_stack_fffffffffffff450;
  double in_stack_fffffffffffff480;
  rotations_t *in_stack_fffffffffffff4a0;
  translations_t *in_stack_fffffffffffff4a8;
  rotation_t *in_stack_fffffffffffff4b0;
  translation_t *in_stack_fffffffffffff4b8;
  rotation_t *in_stack_fffffffffffff4c0;
  rotation_t *in_stack_fffffffffffff4c8;
  translation_t *in_stack_fffffffffffff4d0;
  translation_t *in_stack_fffffffffffff4d8;
  rotation_t *in_stack_fffffffffffff530;
  ulong uVar26;
  translation_t *in_stack_fffffffffffff538;
  RelativeAdapterBase *in_stack_fffffffffffff540;
  size_t in_stack_fffffffffffff588;
  size_t in_stack_fffffffffffff590;
  undefined8 in_stack_fffffffffffff598;
  RelativeAdapterBase *in_stack_fffffffffffff5a0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff5e8;
  RelativeAdapterBase *in_stack_fffffffffffff5f0;
  timeval *__tv;
  ulong local_880;
  ulong local_878;
  ulong local_870;
  ulong local_868;
  ulong local_748;
  ulong local_658;
  double in_stack_fffffffffffff9d0;
  double in_stack_fffffffffffff9d8;
  rotations_t *in_stack_fffffffffffff9e0;
  translations_t *in_stack_fffffffffffff9e8;
  rotation_t *in_stack_fffffffffffff9f0;
  translation_t *in_stack_fffffffffffff9f8;
  rotation_t *in_stack_fffffffffffffa00;
  translation_t *in_stack_fffffffffffffa08;
  size_t in_stack_fffffffffffffa18;
  bearingVectors_t *in_stack_fffffffffffffa20;
  bearingVectors_t *in_stack_fffffffffffffa28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa38;
  MatrixXd *in_stack_fffffffffffffa40;
  ulong local_538;
  ulong local_4a8;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_4a0;
  timeval local_488;
  timeval local_478;
  double local_468;
  ulong local_448;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_428;
  timeval local_410;
  timeval local_400;
  double local_3f0;
  ulong local_3d0;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_3c8;
  timeval local_3b0;
  timeval local_3a0;
  double local_390;
  ulong local_370;
  vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
  local_368;
  timeval local_350;
  timeval local_340;
  double local_330;
  ulong local_310;
  ulong local_2f0;
  timeval local_2e8;
  timeval local_2d8 [14];
  undefined4 local_1ec;
  vector<int,_std::allocator<int>_> local_1e8;
  undefined1 local_1d0 [48];
  undefined1 local_1a0 [328];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_34;
  
  local_34 = 0;
  opengv::initializeRandomSeed();
  local_48 = 0;
  local_50 = 0;
  local_58 = 10;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff428,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff420);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (in_stack_fffffffffffff428,in_stack_fffffffffffff420);
  opengv::generateRandomTranslation(in_stack_fffffffffffff480);
  opengv::generateRandomRotation((double)in_stack_fffffffffffff9e0);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb83e3d);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb83e4a);
  opengv::generateCentralCameraSystem(in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb83e70);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb83e7f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb83e8e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb83e9b);
  local_1ec = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            (in_stack_fffffffffffff448,in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  indices = &local_1e8;
  adapter_00 = (RelativeAdapterBase *)local_1d0;
  this_00 = (CentralRelativeAdapter *)(local_1d0 + 0x18);
  rotation_00 = (rotation_t *)local_1a0;
  this = (RelativeAdapterBase *)(local_1a0 + 0x18);
  uVar6 = local_58;
  opengv::generateRandom2D2DCorrespondences
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
             in_stack_fffffffffffffa18,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             in_stack_fffffffffffffa20,in_stack_fffffffffffffa28,in_stack_fffffffffffffa30,
             in_stack_fffffffffffffa38,in_stack_fffffffffffffa40);
  uVar25 = (undefined4)((ulong)uVar6 >> 0x20);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xb83f65);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb83f74);
  other = (Matrix<double,_3,_4,_0,_3,_4> *)CONCAT44(uVar25,1);
  opengv::extractRelativePose
            (in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
             in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,
             SUB81((ulong)in_stack_fffffffffffff4a8 >> 0x38,0));
  opengv::printExperimentCharacteristics
            ((translation_t *)this_00,rotation_00,(double)this,(double)other);
  opengv::printEssentialMatrix(in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (this_00,(bearingVectors_t *)rotation_00,(bearingVectors_t *)this,(rotation_t *)other);
  local_2f0 = 0x32;
  poVar1 = std::operator<<((ostream *)&std::cout,"running twopt");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xb84069);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  for (local_310 = 0; local_310 < local_2f0; local_310 = local_310 + 1) {
    opengv::relative_pose::twopt
              (in_stack_fffffffffffff5a0,SUB81((ulong)in_stack_fffffffffffff598 >> 0x38,0),
               in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)this,(Matrix<double,_3,_1,_0,_3,_1> *)other);
  }
  gettimeofday(&local_2e8,(__timezone_ptr_t)0x0);
  local_340 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  lVar2 = local_340.tv_sec;
  local_350 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (double)lVar2;
  auVar7._0_8_ = (double)local_350.tv_usec;
  auVar7._8_8_ = uVar6;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar7,auVar15);
  auVar7 = vcvtusi2sd_avx512f(auVar7,local_2f0);
  local_330 = auVar15._0_8_ / auVar7._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,"running fivept_stewenius");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb_00;
  std::
  vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
            *)0xb842b7);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  for (local_370 = 0; local_370 < local_2f0; local_370 = local_370 + 1) {
    opengv::relative_pose::fivept_stewenius(adapter_00);
    std::
    vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    ::operator=((vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
                 *)this_00,
                (vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    ::~vector((vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
               *)this_00);
  }
  gettimeofday(&local_2e8,(__timezone_ptr_t)0x0);
  local_3a0 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  lVar2 = local_3a0.tv_sec;
  local_3b0 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (double)lVar2;
  auVar8._0_8_ = (double)local_3b0.tv_usec;
  auVar8._8_8_ = uVar6;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar8,auVar16);
  auVar7 = vcvtusi2sd_avx512f(auVar8,local_2f0);
  local_390 = auVar15._0_8_ / auVar7._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,"running fivept_nister");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb_01;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb84482);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  for (local_3d0 = 0; local_3d0 < local_2f0; local_3d0 = local_3d0 + 1) {
    opengv::relative_pose::fivept_nister(adapter_00);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::operator=((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)this_00,
                (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)this_00);
  }
  gettimeofday(&local_2e8,(__timezone_ptr_t)0x0);
  local_400 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  lVar2 = local_400.tv_sec;
  local_410 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (double)lVar2;
  auVar9._0_8_ = (double)local_410.tv_usec;
  auVar9._8_8_ = uVar6;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar9,auVar17);
  auVar7 = vcvtusi2sd_avx512f(auVar9,local_2f0);
  local_3f0 = auVar15._0_8_ / auVar7._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,"running fivept_kneip");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb_02;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb8464d);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  opengv::getNindices((int)((ulong)adapter_00 >> 0x20));
  for (local_448 = 0; local_448 < local_2f0; local_448 = local_448 + 1) {
    opengv::relative_pose::fivept_kneip(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::operator=((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)this_00,
                (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)this_00);
  }
  gettimeofday(&local_2e8,(__timezone_ptr_t)0x0);
  local_478 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  lVar2 = local_478.tv_sec;
  local_488 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (double)lVar2;
  auVar10._0_8_ = (double)local_488.tv_usec;
  auVar10._8_8_ = uVar6;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar10,auVar18);
  auVar7 = vcvtusi2sd_avx512f(auVar10,local_2f0);
  local_468 = auVar15._0_8_ / auVar7._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,"running sevenpt");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb_03;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb84851);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  for (local_4a8 = 0; local_4a8 < local_2f0; local_4a8 = local_4a8 + 1) {
    opengv::relative_pose::sevenpt(adapter_00);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::operator=((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)this_00,
                (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)this_00);
  }
  __tv = &local_2e8;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)__tv,(timeval *)local_2d8);
  s = (ostream *)tVar23.tv_usec;
  tVar24 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (double)tVar23.tv_sec;
  auVar11._0_8_ = (double)tVar24.tv_usec;
  auVar11._8_8_ = uVar6;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar11,auVar19);
  auVar7 = vcvtusi2sd_avx512f(auVar11,local_2f0);
  poVar1 = std::operator<<((ostream *)&std::cout,"running eightpt");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb_04;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb84a1c);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  for (local_538 = 0; local_538 < local_2f0; local_538 = local_538 + 1) {
    opengv::relative_pose::eightpt(adapter_00);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)this,(Matrix<double,_3,_3,_0,_3,_3> *)other);
  }
  gettimeofday(&local_2e8,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  tVar24 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (double)tVar23.tv_sec;
  auVar12._0_8_ = (double)tVar24.tv_usec;
  auVar12._8_8_ = uVar6;
  auVar16 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar12,auVar20);
  auVar8 = vcvtusi2sd_avx512f(auVar12,local_2f0);
  std::operator<<((ostream *)&std::cout,"setting perturbed rotation and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"running eigensolver");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xb84bd6);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb84be5);
  uVar6 = 0;
  opengv::getPerturbedPose
            ((translation_t *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,(double)in_stack_fffffffffffff4a8);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb84c23);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  for (local_658 = 0; local_658 < local_2f0; local_658 = local_658 + 1) {
    opengv::relative_pose::RelativeAdapterBase::setR12(this,(rotation_t *)other);
    opengv::relative_pose::eigensolver
              (in_stack_fffffffffffff540,SUB81((ulong)in_stack_fffffffffffff538 >> 0x38,0));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)this,(Matrix<double,_3,_3,_0,_3,_3> *)other);
  }
  gettimeofday(&local_2e8,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  dVar5 = (double)tVar23.tv_sec;
  tVar23 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5;
  auVar13._0_8_ = (double)tVar23.tv_usec;
  auVar13._8_8_ = uVar6;
  auVar17 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar13,auVar21);
  auVar9 = vcvtusi2sd_avx512f(auVar13,local_2f0);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = 0;
  opengv::getPerturbedPose
            ((translation_t *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,(double)in_stack_fffffffffffff4a8);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0xb84e25);
  gettimeofday(local_2d8,(__timezone_ptr_t)0x0);
  for (local_748 = 0; local_748 < local_2f0; local_748 = local_748 + 1) {
    opengv::relative_pose::RelativeAdapterBase::sett12(this,(translation_t *)other);
    opengv::relative_pose::RelativeAdapterBase::setR12(this,(rotation_t *)other);
    opengv::relative_pose::optimize_nonlinear(adapter_00);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this,other);
  }
  gettimeofday(&local_2e8,(__timezone_ptr_t)0x0);
  n = (int)((ulong)adapter_00 >> 0x20);
  tVar23 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  tVar24 = timeval_minus((timeval *)&local_2e8,(timeval *)local_2d8);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (double)tVar23.tv_sec;
  auVar14._0_8_ = (double)tVar24.tv_usec;
  auVar14._8_8_ = uVar6;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar14,auVar22);
  auVar10 = vcvtusi2sd_avx512f(auVar14,local_2f0);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization with 10 indices"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  opengv::getNindices(n);
  opengv::getPerturbedPose
            ((translation_t *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,(double)in_stack_fffffffffffff4a8);
  opengv::relative_pose::RelativeAdapterBase::sett12(this,(translation_t *)other);
  opengv::relative_pose::RelativeAdapterBase::setR12(this,(rotation_t *)other);
  opengv::relative_pose::optimize_nonlinear(in_stack_fffffffffffff450,indices);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from two-points algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)__tv);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from stewenius\' five-point algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_868 = 0;
  while( true ) {
    sVar4 = std::
            vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
            ::size(&local_368);
    if (sVar4 <= local_868) break;
    std::
    vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    ::at((vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
          *)this,(size_type)other);
    poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *)
                                 __tv);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_868 = local_868 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nisters\' five-point algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_870 = 0;
  while( true ) {
    sVar4 = std::
            vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ::size(&local_3c8);
    if (sVar4 <= local_870) break;
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::at((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          *)this,(size_type)other);
    poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)__tv);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_870 = local_870 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from kneip\'s five-point algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_878 = 0;
  while( true ) {
    uVar26 = local_878;
    sVar4 = std::
            vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ::size(&local_428);
    if (sVar4 <= uVar26) break;
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::at((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          *)this,(size_type)other);
    poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)__tv);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_878 = local_878 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from seven-point algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_880 = 0;
  while( true ) {
    sVar4 = std::
            vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ::size(&local_4a0);
    if (sVar4 <= local_880) break;
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::at((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          *)this,(size_type)other);
    poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)__tv);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_880 = local_880 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from eight-point algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)__tv);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from eigensystem based rotation solver:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)__tv);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nonlinear algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)__tv);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "results from nonlinear algorithm with only few correspondences:");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)__tv);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from two-points algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,local_330);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from stewenius\' five-point algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,local_390);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from nisters\' five-point algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,local_3f0);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from kneip\'s five-point algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,local_468);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from seven-point algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar15._0_8_ / auVar7._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from eight-point algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar16._0_8_ / auVar8._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from eigensystem based rotation solver: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar17._0_8_ / auVar9._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from nonlinear algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar18._0_8_ / auVar10._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
             *)this_00);
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter
            ((CentralRelativeAdapter *)0xb859c6);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb859d3);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_00);
  return local_34;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );
  
  //compute and print the essential-matrix
  printEssentialMatrix( position, rotation );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //running experiments
  std::cout << "running twopt" << std::endl;
  translation_t twopt_translation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    twopt_translation = relative_pose::twopt(adapter,true);
  gettimeofday( &toc, 0 );
  double twopt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_stewenius" << std::endl;
  complexEssentials_t fivept_stewenius_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    fivept_stewenius_essentials = relative_pose::fivept_stewenius(adapter);
  gettimeofday( &toc, 0 );
  double fivept_stewenius_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_nister" << std::endl;
  essentials_t fivept_nister_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    fivept_nister_essentials = relative_pose::fivept_nister(adapter);
  gettimeofday( &toc, 0 );
  double fivept_nister_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_kneip" << std::endl;
  rotations_t fivept_kneip_rotations;
  gettimeofday( &tic, 0 );
  std::vector<int> indices5 = getNindices(5);
  for(size_t i = 0; i < iterations; i++)
    fivept_kneip_rotations = relative_pose::fivept_kneip(adapter,indices5);
  gettimeofday( &toc, 0 );
  double fivept_kneip_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running sevenpt" << std::endl;
  essentials_t sevenpt_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    sevenpt_essentials = relative_pose::sevenpt(adapter);
  gettimeofday( &toc, 0 );
  double sevenpt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running eightpt" << std::endl;
  essential_t eightpt_essential;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    eightpt_essential = relative_pose::eightpt(adapter);
  gettimeofday( &toc, 0 );
  double eightpt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed rotation and ";
  std::cout << "running eigensolver" << std::endl;
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  rotation_t eigensolver_rotation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.setR12(R_perturbed);
    eigensolver_rotation = relative_pose::eigensolver(adapter);
  }
  gettimeofday( &toc, 0 );
  double eigensolver_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett12(t_perturbed);
    adapter.setR12(R_perturbed);
    nonlinear_transformation = relative_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with 10 indices" << std::endl;
  std::vector<int> indices10 = getNindices(10);
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      relative_pose::optimize_nonlinear(adapter,indices10);

  //print results
  std::cout << "results from two-points algorithm:" << std::endl;
  std::cout << twopt_translation << std::endl << std::endl;
  std::cout << "results from stewenius' five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_stewenius_essentials.size(); i++ )
    std::cout << fivept_stewenius_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from nisters' five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_nister_essentials.size(); i++ )
    std::cout << fivept_nister_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from kneip's five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_kneip_rotations.size(); i++ )
    std::cout << fivept_kneip_rotations.at(i) << std::endl << std::endl;
  std::cout << "results from seven-point algorithm:" << std::endl;
  for( size_t i = 0; i < sevenpt_essentials.size(); i++ )
    std::cout << sevenpt_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from eight-point algorithm:" << std::endl;
  std::cout << eightpt_essential << std::endl << std::endl;
  std::cout << "results from eigensystem based rotation solver:" << std::endl;
  std::cout << eigensolver_rotation << std::endl << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only few correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from two-points algorithm: ";
  std::cout << twopt_time << std::endl;
  std::cout << "timings from stewenius' five-point algorithm: ";
  std::cout << fivept_stewenius_time << std::endl;
  std::cout << "timings from nisters' five-point algorithm: ";
  std::cout << fivept_nister_time << std::endl;
  std::cout << "timings from kneip's five-point algorithm: ";
  std::cout << fivept_kneip_time << std::endl;
  std::cout << "timings from seven-point algorithm: ";
  std::cout << sevenpt_time << std::endl;
  std::cout << "timings from eight-point algorithm: ";
  std::cout << eightpt_time << std::endl;
  std::cout << "timings from eigensystem based rotation solver: ";
  std::cout << eigensolver_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}